

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:1049:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:1049:17)>
             *this)

{
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *this_00;
  MutexGuarded<kj::Maybe<kj::Promise<int>_>_> *this_01;
  __pid_t _Var1;
  Executor *pEVar2;
  PredicateImpl_conflict4 impl;
  WaitScope waitScope;
  EventLoop loop;
  UnixEventPort port;
  undefined1 local_1f1;
  Fault local_1f0;
  char *pcStack_1e8;
  undefined8 local_1e0;
  undefined **local_1d8;
  int *piStack_1d0;
  Maybe<kj::Promise<int>_> *local_1c8;
  size_t local_1c0;
  bool local_1b8;
  EventLoop *local_1a8;
  undefined4 local_1a0;
  long local_198;
  undefined8 uStack_190;
  EventLoop local_188;
  UnixEventPort local_110;
  
  UnixEventPort::UnixEventPort(&local_110);
  EventLoop::EventLoop(&local_188,&local_110.super_EventPort);
  local_1a0 = 0xffffffff;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = &local_188;
  EventLoop::enterScope(&local_188);
  pEVar2 = getCurrentThreadExecutor();
  this_00 = (this->f).executor;
  local_1d8 = (undefined **)((ulong)local_1d8 & 0xffffffffffffff00);
  kj::_::Mutex::lock(&this_00->mutex);
  (this_00->value).ptr = pEVar2;
  kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  this_01 = (this->f).promise;
  local_1d8 = (undefined **)((ulong)local_1d8 & 0xffffffffffffff00);
  kj::_::Mutex::lock(&this_01->mutex,0);
  local_1c8 = &this_01->value;
  local_1d8 = &PTR_check_00631520;
  piStack_1d0 = (int *)&local_1f1;
  local_1f0.exception = local_1f0.exception & 0xffffffffffffff00;
  kj::_::Mutex::wait(&this_01->mutex,&local_1d8);
  if ((this_01->value).ptr.isSet == false) {
    local_1f0.exception = (Exception *)0x0;
    local_1d8 = (undefined **)0x0;
    piStack_1d0 = (int *)0x0;
    kj::_::Debug::Fault::init
              (&local_1f0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
              );
    kj::_::Debug::Fault::fatal(&local_1f0);
  }
  kj::_::Mutex::unlock(&this_01->mutex,EXCLUSIVE,(Waiter *)0x0);
  local_1f0.exception = (Exception *)0x4b2c12;
  pcStack_1e8 = "operator()";
  local_1e0 = 0x3900000428;
  _Var1 = Promise<int>::wait(&(this_01->value).ptr.field_1.value,&local_1a8);
  piStack_1d0 = (this->f).MAGIC_VALUE;
  local_1b8 = _Var1 == *piStack_1d0;
  local_1d8 = (undefined **)CONCAT44(local_1d8._4_4_,_Var1);
  local_1c8 = (Maybe<kj::Promise<int>_> *)0x4a8289;
  local_1c0 = 5;
  if ((!local_1b8) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[60],kj::_::DebugComparison<int,int_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
               ,0x428,ERROR,
               "\"failed: expected \" \"promisePtr->wait(waitScope) == MAGIC_VALUE\", _kjCondition",
               (char (*) [60])"failed: expected promisePtr->wait(waitScope) == MAGIC_VALUE",
               (DebugComparison<int,_const_int_&> *)&local_1d8);
  }
  if (local_198 == 0) {
    EventLoop::leaveScope(local_1a8);
  }
  EventLoop::~EventLoop(&local_188);
  UnixEventPort::~UnixEventPort(&local_110);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }